

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::m_formatter<spdlog::details::null_scoped_padder>::format
          (m_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  byte bVar1;
  size_t sVar2;
  buffer<char> *buf;
  ulong uVar3;
  string_view fmt;
  format_args args;
  uint local_28 [4];
  
  local_28[0] = tm_time->tm_mon + 1;
  if (local_28[0] < 100) {
    bVar1 = (byte)((local_28[0] & 0xff) / 10);
    sVar2 = (dest->super_buffer<char>).size_;
    uVar3 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar3 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar3;
    (dest->super_buffer<char>).ptr_[sVar2] = bVar1 | 0x30;
    sVar2 = (dest->super_buffer<char>).size_;
    uVar3 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar3 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar3;
    (dest->super_buffer<char>).ptr_[sVar2] = (char)local_28[0] + bVar1 * -10 | 0x30;
  }
  else {
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_28;
    args.desc_ = 1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt,args,(locale_ref)0x0);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_mon + 1, dest);
    }